

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::VariablePatternSyntax>
          (DeepCloneVisitor *this,VariablePatternSyntax *node,BumpAllocator *alloc)

{
  VariablePatternSyntax *pVVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->dot,alloc);
  local_38 = parsing::Token::deepClone(&node->variableName,alloc);
  pVVar1 = BumpAllocator::
           emplace<slang::syntax::VariablePatternSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return (SyntaxNode *)pVVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }